

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstReader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::SstReader::EndStep(SstReader *this)

{
  SstStream Stream;
  SstStatusValue SVar1;
  SstMarshalMethod SVar2;
  int iVar3;
  size_t UEffectiveTimestep;
  undefined8 uVar4;
  allocator local_9c;
  allocator local_9b;
  allocator local_9a;
  allocator local_99;
  ScopedTimer __var2454;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  if ((this->super_Engine).m_BetweenStepPairs == false) {
    std::__cxx11::string::string((string *)&local_30,"Engine",(allocator *)&__var2454);
    std::__cxx11::string::string((string *)&local_50,"SstReader",&local_9a);
    std::__cxx11::string::string((string *)&local_70,"EndStep",&local_9b);
    std::__cxx11::string::string
              ((string *)&local_90,"EndStep() is called without a successful BeginStep()",&local_9c)
    ;
    helper::Throw<std::logic_error>(&local_30,&local_50,&local_70,&local_90,-1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  (this->super_Engine).m_BetweenStepPairs = false;
  if (EndStep()::__var454 == '\0') {
    iVar3 = __cxa_guard_acquire(&EndStep()::__var454);
    if (iVar3 != 0) {
      uVar4 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/sst/SstReader.cpp"
                                  ,"virtual void adios2::core::engine::SstReader::EndStep()",0x1c6);
      EndStep::__var454 = (void *)ps_timer_create_(uVar4);
      __cxa_guard_release(&EndStep()::__var454);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&__var2454,EndStep::__var454);
  if (((this->super_Engine).m_ReaderSelectionsLocked == true) &&
     (this->m_DefinitionsNotified == false)) {
    Stream = this->m_Input;
    UEffectiveTimestep = SstCurrentStep(Stream);
    SstReaderDefinitionLock(Stream,UEffectiveTimestep);
    this->m_DefinitionsNotified = true;
  }
  SVar2 = this->m_WriterMarshalMethod;
  if (SVar2 == SstMarshalBP) {
    (*(this->super_Engine)._vptr_Engine[7])(this);
    if (this->m_BP3Deserializer != (BP3Deserializer *)0x0) {
      (**(code **)(*(long *)this->m_BP3Deserializer + 8))();
    }
  }
  else {
    if (SVar2 != SstMarshalFFS) goto LAB_006662df;
    SVar1 = SstFFSPerformGets(this->m_Input);
    if (SVar1 != SstSuccess) {
      std::__cxx11::string::string((string *)&local_30,"Engine",&local_9a);
      std::__cxx11::string::string((string *)&local_50,"SstReader",&local_9b);
      std::__cxx11::string::string((string *)&local_70,"EndStep",&local_9c);
      std::__cxx11::string::string
                ((string *)&local_90,"Writer failed before returning data",&local_99);
      helper::Throw<std::runtime_error>(&local_30,&local_50,&local_70,&local_90,-1);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  SVar2 = this->m_WriterMarshalMethod;
LAB_006662df:
  if (SVar2 == SstMarshalBP5) {
    BP5PerformGets(this);
  }
  SstReleaseStep(this->m_Input);
  std::
  _Hashtable<const_adios2::core::VariableBase_*,_std::pair<const_adios2::core::VariableBase_*const,_std::unique_ptr<adios2::MinVarInfo,_std::default_delete<adios2::MinVarInfo>_>_>,_std::allocator<std::pair<const_adios2::core::VariableBase_*const,_std::unique_ptr<adios2::MinVarInfo,_std::default_delete<adios2::MinVarInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_adios2::core::VariableBase_*>,_std::hash<const_adios2::core::VariableBase_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->m_InfoMap)._M_h);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2454);
  return;
}

Assistant:

void SstReader::EndStep()
{
    if (!m_BetweenStepPairs)
    {
        helper::Throw<std::logic_error>("Engine", "SstReader", "EndStep",
                                        "EndStep() is called without a successful BeginStep()");
    }
    m_BetweenStepPairs = false;
    PERFSTUBS_SCOPED_TIMER_FUNC();
    if (m_ReaderSelectionsLocked && !m_DefinitionsNotified)
    {
        SstReaderDefinitionLock(m_Input, SstCurrentStep(m_Input));
        m_DefinitionsNotified = true;
    }
    if (m_WriterMarshalMethod == SstMarshalFFS)
    {
        SstStatusValue Result;
        // this does all the deferred gets and fills in the variable array data
        Result = SstFFSPerformGets(m_Input);
        if (Result != SstSuccess)
        {
            // tentative, until we change EndStep so that it has a return value
            helper::Throw<std::runtime_error>("Engine", "SstReader", "EndStep",
                                              "Writer failed before returning data");
        }
    }
    else if (m_WriterMarshalMethod == SstMarshalBP)
    {

        PerformGets();
        //  I'm assuming that the DoGet calls below have been constructing
        //  some kind of data structure that indicates what data this reader
        //  needs from different writers, what read requests it needs to
        //  make, where to put the data when it arrives, etc.  Therefore the
        //  pseudocode here looks like:
        //         IssueReadRequests()   I.E. do calls to SstReadRemoteMemory()
        //         as necessary to get the data coming these are asynchronous
        //	   so that they can happen in parallel.
        //         WaitForReadRequests()   Wait for each of these read requests
        //         to complete.  See the SstWaitForCompletion function.
        //         FillReadRequests()    Given the data that was just read,
        //         place it appropriately into the waiting vars.
        //	   ClearReadRequests()  Clean up as necessary
        //
        delete m_BP3Deserializer;
    }
    if (m_WriterMarshalMethod == SstMarshalBP5)
    {

        BP5PerformGets();
    }
    else
    {
        // unknown marshaling method, shouldn't happen
    }
    SstReleaseStep(m_Input);
    m_InfoMap.clear();
}